

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey-ssh1.c
# Opt level: O2

ssh_cipher * des3_pubkey_cipher(void *vkey)

{
  ssh_cipher *psVar1;
  uint8_t iv [8];
  uint8_t keys3 [24];
  
  psVar1 = des3_cbc3_new(&ssh_3des_ssh1);
  keys3._0_8_ = *vkey;
  keys3._8_8_ = *(undefined8 *)((long)vkey + 8);
  keys3._16_8_ = *vkey;
  (*psVar1->vt->setkey)(psVar1,keys3);
  smemclr(keys3,0x18);
  iv[0] = '\0';
  iv[1] = '\0';
  iv[2] = '\0';
  iv[3] = '\0';
  iv[4] = '\0';
  iv[5] = '\0';
  iv[6] = '\0';
  iv[7] = '\0';
  (*psVar1->vt->setiv)(psVar1,iv);
  return psVar1;
}

Assistant:

static ssh_cipher *des3_pubkey_cipher(const void *vkey)
{
    ssh_cipher *c = ssh_cipher_new(&ssh_3des_ssh1);
    uint8_t keys3[24], iv[8];

    memcpy(keys3, vkey, 16);
    memcpy(keys3 + 16, vkey, 8);
    ssh_cipher_setkey(c, keys3);
    smemclr(keys3, sizeof(keys3));

    memset(iv, 0, 8);
    ssh_cipher_setiv(c, iv);

    return c;
}